

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::
     RenderLineSegments<ImPlot::GetterXsYs<signed_char>,ImPlot::GetterXsYRef<signed_char>,ImPlot::TransformerLinLog>
               (GetterXsYs<signed_char> *getter1,GetterXsYRef<signed_char> *getter2,
               TransformerLinLog *transformer,ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  float fVar2;
  double dVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  ImPlotPlot *pIVar7;
  double dVar8;
  ImPlotContext *pIVar9;
  ImPlotContext *pIVar10;
  long lVar11;
  int iVar12;
  float fVar13;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_78;
  int local_6c;
  ImDrawList *local_68;
  ImPlotContext *local_60;
  undefined1 local_58 [8];
  GetterXsYRef<signed_char> *local_50;
  TransformerLinLog *local_48;
  int local_40;
  ImU32 local_3c;
  float local_38;
  
  local_68 = DrawList;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    local_40 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_40 = getter1->Count;
    }
    local_58 = (undefined1  [8])getter1;
    local_50 = getter2;
    local_48 = transformer;
    local_3c = col;
    local_38 = line_weight;
    RenderPrimitives<ImPlot::LineSegmentsRenderer<ImPlot::GetterXsYs<signed_char>,ImPlot::GetterXsYRef<signed_char>,ImPlot::TransformerLinLog>>
              ((LineSegmentsRenderer<ImPlot::GetterXsYs<signed_char>,_ImPlot::GetterXsYRef<signed_char>,_ImPlot::TransformerLinLog>
                *)local_58,DrawList,&GImPlot->CurrentPlot->PlotRect);
  }
  else {
    local_60 = GImPlot;
    local_6c = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_6c = getter1->Count;
    }
    if (0 < local_6c) {
      iVar12 = 0;
      do {
        pIVar9 = GImPlot;
        iVar5 = getter1->Count;
        lVar11 = (long)(((getter1->Offset + iVar12) % iVar5 + iVar5) % iVar5) *
                 (long)getter1->Stride;
        cVar4 = getter1->Xs[lVar11];
        dVar8 = log10((double)(int)getter1->Ys[lVar11] /
                      GImPlot->CurrentPlot->YAxis[transformer->YAxis].Range.Min);
        pIVar10 = GImPlot;
        iVar5 = transformer->YAxis;
        pIVar7 = pIVar9->CurrentPlot;
        dVar3 = pIVar7->YAxis[iVar5].Range.Min;
        local_58._0_4_ =
             (undefined4)
             (((double)(int)cVar4 - (pIVar7->XAxis).Range.Min) * pIVar9->Mx +
             (double)pIVar9->PixelRange[iVar5].Min.x);
        local_58._4_4_ =
             (float)((((double)(float)(dVar8 / pIVar9->LogDenY[iVar5]) *
                       (pIVar7->YAxis[iVar5].Range.Max - dVar3) + dVar3) - dVar3) *
                     pIVar9->My[iVar5] + (double)pIVar9->PixelRange[iVar5].Min.y);
        iVar6 = getter2->Count;
        cVar4 = getter2->Xs
                [(long)(((getter2->Offset + iVar12) % iVar6 + iVar6) % iVar6) *
                 (long)getter2->Stride];
        dVar8 = log10(getter2->YRef / GImPlot->CurrentPlot->YAxis[iVar5].Range.Min);
        iVar5 = transformer->YAxis;
        pIVar7 = pIVar10->CurrentPlot;
        dVar3 = pIVar7->YAxis[iVar5].Range.Min;
        local_78.x = (float)(((double)(int)cVar4 - (pIVar7->XAxis).Range.Min) * pIVar10->Mx +
                            (double)pIVar10->PixelRange[iVar5].Min.x);
        fVar13 = (float)((((double)(float)(dVar8 / pIVar10->LogDenY[iVar5]) *
                           (pIVar7->YAxis[iVar5].Range.Max - dVar3) + dVar3) - dVar3) *
                         pIVar10->My[iVar5] + (double)pIVar10->PixelRange[iVar5].Min.y);
        local_78.y = fVar13;
        pIVar7 = local_60->CurrentPlot;
        fVar2 = (float)local_58._4_4_;
        if (fVar13 <= (float)local_58._4_4_) {
          fVar2 = fVar13;
        }
        if ((fVar2 < (pIVar7->PlotRect).Max.y) &&
           (fVar2 = (float)(~-(uint)(fVar13 <= (float)local_58._4_4_) & (uint)fVar13 |
                           local_58._4_4_ & -(uint)(fVar13 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar7->PlotRect).Min.y, *pfVar1 <= fVar2 && fVar2 != *pfVar1)) {
          fVar2 = (float)local_58._0_4_;
          if (local_78.x <= (float)local_58._0_4_) {
            fVar2 = local_78.x;
          }
          if ((fVar2 < (pIVar7->PlotRect).Max.x) &&
             (fVar2 = (float)(~-(uint)(local_78.x <= (float)local_58._0_4_) & (uint)local_78.x |
                             local_58._0_4_ & -(uint)(local_78.x <= (float)local_58._0_4_)),
             (pIVar7->PlotRect).Min.x <= fVar2 && fVar2 != (pIVar7->PlotRect).Min.x)) {
            ImDrawList::AddLine(local_68,(ImVec2 *)local_58,&local_78,col,line_weight);
          }
        }
        iVar12 = iVar12 + 1;
      } while (local_6c != iVar12);
    }
  }
  return;
}

Assistant:

inline void RenderLineSegments(const Getter1& getter1, const Getter2& getter2, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        int I = ImMin(getter1.Count, getter2.Count);
        for (int i = 0; i < I; ++i) {
            ImVec2 p1 = transformer(getter1(i));
            ImVec2 p2 = transformer(getter2(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
        }
    }
    else {
        RenderPrimitives(LineSegmentsRenderer<Getter1,Getter2,Transformer>(getter1, getter2, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}